

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O1

void __thiscall
ScalarEstimator::ScalarEstimator
          (ScalarEstimator *this,Property *estimate,StochasticProcess *src,Time *time)

{
  uint uVar1;
  double *pdVar2;
  string local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60.field_2._M_allocated_capacity = 0x6f74616d69747345;
  local_60.field_2._8_2_ = 0x72;
  local_60._M_string_length = 9;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  Estimator::Estimator(&this->super_Estimator,src,time,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ScalarEstimator_0015ecd0;
  uVar1 = *estimate;
  (this->super_Estimator).nEstimate = uVar1;
  (this->super_Estimator).nSamples = 0;
  this->aDist = (double *)0x0;
  this->nDist = 0;
  if ((uVar1 & 2) != 0) {
    this->nDist = 100;
    pdVar2 = (double *)operator_new__(800);
    this->aDist = pdVar2;
    this->aDistRange[0] = -5.0;
    this->aDistRange[1] = 5.0;
    this->dDistOffset = -5.0;
    this->dDistScale = 0.1;
  }
  (this->super_Estimator).nSamples = 0;
  this->dSample = 0.0;
  this->dOne = 0.0;
  this->dTwo = 0.0;
  this->dThree = 0.0;
  if ((this->aDist != (double *)0x0) && (0 < (long)this->nDist)) {
    memset(this->aDist,0,(long)this->nDist << 3);
  }
  return;
}

Assistant:

ScalarEstimator::ScalarEstimator(const Property& estimate, StochasticProcess *src, Time *time)
: Estimator(src, time)
{
	nEstimate = estimate;
	nSamples = 0;
	aDist = 0;
	nDist = 0;
	if(nEstimate & EST_DENS) {
		nDist = 100;
		aDist = new double[nDist];
		aDistRange[0] = -5.0;
		aDistRange[1] = 5.0;
		dDistOffset = double(aDistRange[0]);
		dDistScale = (double(aDistRange[1]) - double(aDistRange[0])) / double(nDist);
	}
	init();
}